

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lifecycle_hooks.cpp
# Opt level: O1

shared_ptr<TestClientContextState,_true> WithLifecycleState(Connection *conn)

{
  ClientContext *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::ClientContext,_true> *in_RSI;
  shared_ptr<TestClientContextState,_true> sVar3;
  shared_ptr<duckdb::ClientContextState,_true> local_50;
  string local_40;
  
  pCVar1 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(in_RSI);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005d1480;
  this[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TestClientContextState_005d14d0;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)conn = this + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(conn + 8) = this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  this_00 = duckdb::
            unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
            ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                          *)(pCVar1 + 0x28));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"test_state","");
  local_50.internal.super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)conn;
  local_50.internal.super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(conn + 8);
  if (local_50.internal.super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_50.internal.super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_50.internal.
           super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_50.internal.super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_50.internal.
           super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  duckdb::RegisteredStateManager::Insert(this_00,&local_40,&local_50);
  _Var2._M_pi = extraout_RDX;
  if (local_50.internal.super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_50.internal.
               super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)conn;
  return (shared_ptr<TestClientContextState,_true>)
         sVar3.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TestClientContextState> WithLifecycleState(const Connection &conn) {
	auto &register_state = conn.context->registered_state;
	auto state = make_shared_ptr<TestClientContextState>();
	register_state->Insert("test_state", state);
	return state;
}